

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::FixedParser<long>(void *object,char *ptr,ParseContext *ctx)

{
  uint32 size_00;
  int size;
  ParseContext *ctx_local;
  char *ptr_local;
  void *object_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)object;
  size_00 = ReadSize((char **)&ctx_local);
  if (ctx_local == (ParseContext *)0x0) {
    object_local = (void *)0x0;
  }
  else {
    object_local = EpsCopyInputStream::ReadPackedFixed<long>
                             (&ctx->super_EpsCopyInputStream,(char *)ctx_local,size_00,
                              (RepeatedField<long> *)ptr_local);
  }
  return (char *)object_local;
}

Assistant:

const char* FixedParser(void* object, const char* ptr, ParseContext* ctx) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ctx->ReadPackedFixed(ptr, size,
                              static_cast<RepeatedField<T>*>(object));
}